

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp.h
# Opt level: O3

word Exp_Truth6(int nVars,Vec_Int_t *p,word *puFanins)

{
  int iVar1;
  uint uVar2;
  void *__ptr;
  ulong uVar3;
  word wVar4;
  word wVar5;
  ulong uVar6;
  word *pwVar7;
  
  pwVar7 = Exp_Truth6::Truth6;
  if (puFanins != (word *)0x0) {
    pwVar7 = puFanins;
  }
  iVar1 = p->nSize;
  uVar6 = (ulong)iVar1;
  __ptr = calloc((long)(iVar1 / 2),8);
  if (1 < (long)uVar6) {
    uVar3 = 0;
    do {
      if (uVar6 <= uVar3) {
LAB_004bf1f9:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar2 = p->pArray[uVar3];
      if (uVar2 == 0xffffffff) {
        wVar4 = 0;
      }
      else if (uVar2 == 0xfffffffe) {
        wVar4 = 0xffffffffffffffff;
      }
      else if ((int)uVar2 < nVars * 2) {
        if ((uVar2 & 1) == 0) {
          wVar4 = pwVar7[(int)uVar2 >> 1];
        }
        else {
          wVar4 = ~pwVar7[(int)uVar2 / 2];
        }
      }
      else {
        wVar4 = -(ulong)(uVar2 & 1) ^
                *(ulong *)((long)__ptr + (long)(int)((uVar2 >> 1) - nVars) * 8);
      }
      if (uVar6 <= uVar3 + 1) goto LAB_004bf1f9;
      uVar2 = p->pArray[uVar3 + 1];
      if (uVar2 == 0xffffffff) {
        wVar5 = 0;
      }
      else if (uVar2 == 0xfffffffe) {
        wVar5 = 0xffffffffffffffff;
      }
      else if ((int)uVar2 < nVars * 2) {
        if ((uVar2 & 1) == 0) {
          wVar5 = pwVar7[(int)uVar2 >> 1];
        }
        else {
          wVar5 = ~pwVar7[(int)uVar2 / 2];
        }
      }
      else {
        wVar5 = -(ulong)(uVar2 & 1) ^
                *(ulong *)((long)__ptr + (long)(int)((uVar2 >> 1) - nVars) * 8);
      }
      *(word *)((long)__ptr + uVar3 * 4) = wVar5 & wVar4;
      uVar3 = uVar3 + 2;
    } while ((ulong)(uint)(iVar1 / 2) * 2 != uVar3);
  }
  if (iVar1 < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x1f8,"int Vec_IntEntryLast(Vec_Int_t *)");
  }
  uVar2 = p->pArray[uVar6 - 1];
  if (uVar2 == 0xffffffff) {
    wVar4 = 0;
  }
  else if (uVar2 == 0xfffffffe) {
    wVar4 = 0xffffffffffffffff;
  }
  else {
    if (nVars * 2 <= (int)uVar2) {
      wVar4 = -(ulong)(uVar2 & 1) ^ *(ulong *)((long)__ptr + (long)(int)((uVar2 >> 1) - nVars) * 8);
      goto LAB_004bf1d9;
    }
    if ((uVar2 & 1) == 0) {
      wVar4 = pwVar7[(int)uVar2 >> 1];
    }
    else {
      wVar4 = ~pwVar7[(int)uVar2 / 2];
    }
  }
  if (__ptr == (void *)0x0) {
    return wVar4;
  }
LAB_004bf1d9:
  free(__ptr);
  return wVar4;
}

Assistant:

static inline word Exp_Truth6( int nVars, Vec_Int_t * p, word * puFanins )
{
    static word Truth6[6] = {
        ABC_CONST(0xAAAAAAAAAAAAAAAA),
        ABC_CONST(0xCCCCCCCCCCCCCCCC),
        ABC_CONST(0xF0F0F0F0F0F0F0F0),
        ABC_CONST(0xFF00FF00FF00FF00),
        ABC_CONST(0xFFFF0000FFFF0000),
        ABC_CONST(0xFFFFFFFF00000000)
    };
    word * puNodes, Res;
    int i;
    if ( puFanins == NULL )
        puFanins = (word *)Truth6;
    puNodes = ABC_CALLOC( word, Exp_NodeNum(p) );
    for ( i = 0; i < Exp_NodeNum(p); i++ )
        puNodes[i] = Exp_Truth6Lit( nVars, Vec_IntEntry(p, 2*i+0), puFanins, puNodes ) & 
                     Exp_Truth6Lit( nVars, Vec_IntEntry(p, 2*i+1), puFanins, puNodes );
    Res = Exp_Truth6Lit( nVars, Vec_IntEntryLast(p), puFanins, puNodes );
    ABC_FREE( puNodes );
    return Res;
}